

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O2

void PaUtil_ResetBufferProcessor(PaUtilBufferProcessor *bp)

{
  unsigned_long uVar1;
  
  uVar1 = bp->initialFramesInTempOutputBuffer;
  bp->framesInTempInputBuffer = bp->initialFramesInTempInputBuffer;
  bp->framesInTempOutputBuffer = uVar1;
  if (bp->initialFramesInTempInputBuffer != 0) {
    memset(bp->tempInputBuffer,0,
           (ulong)bp->inputChannelCount *
           (ulong)bp->bytesPerUserInputSample * bp->framesPerTempBuffer);
    uVar1 = bp->framesInTempOutputBuffer;
  }
  if (uVar1 != 0) {
    memset(bp->tempOutputBuffer,0,
           (ulong)bp->outputChannelCount *
           (ulong)bp->bytesPerUserOutputSample * bp->framesPerTempBuffer);
    return;
  }
  return;
}

Assistant:

void PaUtil_ResetBufferProcessor( PaUtilBufferProcessor* bp )
{
    unsigned long tempInputBufferSize, tempOutputBufferSize;

    bp->framesInTempInputBuffer = bp->initialFramesInTempInputBuffer;
    bp->framesInTempOutputBuffer = bp->initialFramesInTempOutputBuffer;

    if( bp->framesInTempInputBuffer > 0 )
    {
        tempInputBufferSize =
            bp->framesPerTempBuffer * bp->bytesPerUserInputSample * bp->inputChannelCount;
        memset( bp->tempInputBuffer, 0, tempInputBufferSize );
    }

    if( bp->framesInTempOutputBuffer > 0 )
    {
        tempOutputBufferSize =
            bp->framesPerTempBuffer * bp->bytesPerUserOutputSample * bp->outputChannelCount;
        memset( bp->tempOutputBuffer, 0, tempOutputBufferSize );
    }
}